

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionSettings.cpp
# Opt level: O2

void __thiscall FIX::SessionSettings::set(SessionSettings *this,Dictionary *defaults)

{
  _Base_ptr p_Var1;
  
  Dictionary::operator=(&this->m_defaults,defaults);
  for (p_Var1 = (this->m_settings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_settings)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    Dictionary::merge((Dictionary *)&p_Var1[0xc]._M_parent,defaults);
  }
  return;
}

Assistant:

void SessionSettings::set( const Dictionary& defaults ) EXCEPT ( ConfigError )
{
  m_defaults = defaults;
  Dictionaries::iterator i = m_settings.begin();
  for( i = m_settings.begin(); i != m_settings.end(); ++i )
    i->second.merge( defaults );
}